

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ctx.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdChroma::emulate_mthd(MthdChroma *this)

{
  uint32_t uVar1;
  pgraph_color color;
  
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
      chipset.card_type < 4) {
    color = pgraph_expand_color(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                                (this->super_SingleMthdTest).super_MthdTest.val);
    uVar1 = pgraph_to_a1r10g10b10(color);
  }
  else {
    if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x17) {
      nv04_pgraph_set_chroma_nv01
                (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                 (this->super_SingleMthdTest).super_MthdTest.val);
      return;
    }
    uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.chroma = uVar1;
  return;
}

Assistant:

void emulate_mthd() override {
		if (chipset.card_type < 4) {
			exp.chroma = pgraph_to_a1r10g10b10(pgraph_expand_color(&exp, val));
		} else {
			if (cls == 0x17)
				nv04_pgraph_set_chroma_nv01(&exp, val);
			else
				exp.chroma = val;
		}
	}